

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<float>_>::Inverse
          (TPZMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *Inv,
          DecomposeType dec)

{
  long lVar1;
  long lVar2;
  _func_int **pp_Var3;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  long lVar7;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  if (lVar1 != 0) {
    if (lVar1 == (this->super_TPZBaseMatrix).fCol) {
      (*(Inv->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xe])(Inv,lVar1,lVar1);
      (*(Inv->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])(Inv);
      if (0 < lVar1) {
        lVar7 = 0;
        do {
          lVar2 = (Inv->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
          if ((lVar2 <= lVar7) ||
             ((Inv->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar7)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Inv->fElem[lVar2 * lVar7 + lVar7]._M_value = 0x3f800000;
          lVar7 = lVar7 + 1;
        } while (lVar1 != lVar7);
      }
      pp_Var3 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
      if (dec == ENoDecompose) {
        iVar4 = (*pp_Var3[0x10])(this);
        UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x41];
        if (iVar4 == 0) {
          uVar6 = 1;
        }
        else {
          uVar6 = 4;
        }
        iVar4 = (*UNRECOVERED_JUMPTABLE)(this,Inv,uVar6,UNRECOVERED_JUMPTABLE);
        return iVar4;
      }
      (*pp_Var3[0x41])(this,Inv);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "int TPZMatrix<std::complex<float>>::Inverse(TPZFMatrix<TVar> &, DecomposeType) [TVar = std::complex<float>]"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - matrix must be square - Rows() = ",0x24);
      poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," - Cols() = ",0xc);
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  return 0;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}